

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_lexer.c
# Opt level: O0

Token update_state(IncludeState *s,int eoi,uchar *cur,uchar *tok,Token val)

{
  Token val_local;
  uchar *tok_local;
  uchar *cur_local;
  int eoi_local;
  IncludeState *s_local;
  
  if (eoi == 0) {
    s->bytes_left = s->bytes_left - ((int)cur - (int)s->source);
    s->source = (char *)cur;
    s->token = (char *)tok;
  }
  else {
    s->bytes_left = 0;
    s->source = s->source_base + s->orig_length;
    if ((tok < sentinel) || (sentinel + 7 < tok)) {
      s->token = (char *)tok;
    }
    else {
      s->token = s->source;
    }
  }
  s->tokenlen = (int)s->source - (int)s->token;
  s->tokenval = val;
  return val;
}

Assistant:

static Token update_state(IncludeState *s, int eoi, const uchar *cur,
                          const uchar *tok, const Token val)
{
    if (eoi)
    {
        s->bytes_left = 0;
        s->source = (const char *) s->source_base + s->orig_length;
        if ( (tok >= sentinel) && (tok < (sentinel+YYMAXFILL)) )
            s->token = s->source;
        else
            s->token = (const char *) tok;
    } // if
    else
    {
        s->bytes_left -= (unsigned int) (cur - ((const uchar *) s->source));
        s->source = (const char *) cur;
        s->token = (const char *) tok;
    } // else
    s->tokenlen = (unsigned int) (s->source - s->token);
    s->tokenval = val;
    return val;
}